

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_j2k_t * opj_j2k_create_decompress(void)

{
  undefined1 *puVar1;
  int num_threads;
  opj_j2k_t *p_j2k;
  opj_tcp_t *poVar2;
  OPJ_BYTE *pOVar3;
  opj_codestream_index_t *ptr;
  opj_marker_info_t *poVar4;
  opj_procedure_list_t *poVar5;
  opj_thread_pool_t *poVar6;
  
  p_j2k = (opj_j2k_t *)opj_calloc(1,0x150);
  if (p_j2k == (opj_j2k_t *)0x0) {
    return (opj_j2k_t *)0x0;
  }
  p_j2k->m_is_decoder = 1;
  puVar1 = &(p_j2k->m_cp).field_0x90;
  *puVar1 = *puVar1 | 6;
  poVar2 = (opj_tcp_t *)opj_calloc(1,0x1640);
  (p_j2k->m_specific_param).m_decoder.m_default_tcp = poVar2;
  if (poVar2 != (opj_tcp_t *)0x0) {
    pOVar3 = (OPJ_BYTE *)opj_calloc(1,1000);
    (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar3;
    if (pOVar3 != (OPJ_BYTE *)0x0) {
      (p_j2k->m_specific_param).m_decoder.m_header_data_size = 1000;
      (p_j2k->m_specific_param).m_decoder.m_tile_ind_to_dec = -1;
      (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
      ptr = (opj_codestream_index_t *)opj_calloc(1,0x38);
      if (ptr != (opj_codestream_index_t *)0x0) {
        ptr->maxmarknum = 100;
        ptr->marknum = 0;
        poVar4 = (opj_marker_info_t *)opj_calloc(100,0x18);
        ptr->marker = poVar4;
        if (poVar4 != (opj_marker_info_t *)0x0) {
          ptr->tile_index = (opj_tile_index_t *)0x0;
          p_j2k->cstr_index = ptr;
          poVar5 = opj_procedure_list_create();
          p_j2k->m_validation_list = poVar5;
          if (poVar5 != (opj_procedure_list_t *)0x0) {
            poVar5 = opj_procedure_list_create();
            p_j2k->m_procedure_list = poVar5;
            if (poVar5 != (opj_procedure_list_t *)0x0) {
              num_threads = opj_j2k_get_default_thread_count();
              poVar6 = opj_thread_pool_create(num_threads);
              p_j2k->m_tp = poVar6;
              if (poVar6 != (opj_thread_pool_t *)0x0) {
                return p_j2k;
              }
              poVar6 = opj_thread_pool_create(0);
              p_j2k->m_tp = poVar6;
              if (poVar6 != (opj_thread_pool_t *)0x0) {
                return p_j2k;
              }
            }
          }
          goto LAB_001112a6;
        }
        opj_free(ptr);
      }
      p_j2k->cstr_index = (opj_codestream_index_t *)0x0;
    }
  }
LAB_001112a6:
  opj_j2k_destroy(p_j2k);
  return (opj_j2k_t *)0x0;
}

Assistant:

opj_j2k_t* opj_j2k_create_decompress(void)
{
    opj_j2k_t *l_j2k = (opj_j2k_t*) opj_calloc(1, sizeof(opj_j2k_t));
    if (!l_j2k) {
        return 00;
    }

    l_j2k->m_is_decoder = 1;
    l_j2k->m_cp.m_is_decoder = 1;
    /* in the absence of JP2 boxes, consider different bit depth / sign */
    /* per component is allowed */
    l_j2k->m_cp.allow_different_bit_depth_sign = 1;

#ifdef OPJ_DISABLE_TPSOT_FIX
    l_j2k->m_specific_param.m_decoder.m_nb_tile_parts_correction_checked = 1;
#endif

    l_j2k->m_specific_param.m_decoder.m_default_tcp = (opj_tcp_t*) opj_calloc(1,
            sizeof(opj_tcp_t));
    if (!l_j2k->m_specific_param.m_decoder.m_default_tcp) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE *) opj_calloc(1,
            OPJ_J2K_DEFAULT_HEADER_SIZE);
    if (! l_j2k->m_specific_param.m_decoder.m_header_data) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_specific_param.m_decoder.m_header_data_size =
        OPJ_J2K_DEFAULT_HEADER_SIZE;

    l_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = -1 ;

    l_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = 0 ;

    /* codestream index creation */
    l_j2k->cstr_index = opj_j2k_create_cstr_index();
    if (!l_j2k->cstr_index) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    /* validation list creation */
    l_j2k->m_validation_list = opj_procedure_list_create();
    if (! l_j2k->m_validation_list) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    /* execution list creation */
    l_j2k->m_procedure_list = opj_procedure_list_create();
    if (! l_j2k->m_procedure_list) {
        opj_j2k_destroy(l_j2k);
        return 00;
    }

    l_j2k->m_tp = opj_thread_pool_create(opj_j2k_get_default_thread_count());
    if (!l_j2k->m_tp) {
        l_j2k->m_tp = opj_thread_pool_create(0);
    }
    if (!l_j2k->m_tp) {
        opj_j2k_destroy(l_j2k);
        return NULL;
    }

    return l_j2k;
}